

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithCustomQualifier_Test::
TestBody(ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithCustomQualifier_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference rhs;
  CertErrors *in_R9;
  undefined1 auVar3 [16];
  Span<const_unsigned_char> data;
  string_view s;
  Input extension_value;
  AssertHelper local_210;
  Message local_208;
  Span<const_unsigned_char> local_200;
  Input local_1f0;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_1;
  Message local_1c8;
  size_type local_1c0;
  uint local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_180;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__1;
  Input local_f8;
  bool local_e1;
  undefined1 local_e0 [7];
  bool result;
  CertErrors errors;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> policies;
  string local_a8;
  AssertHelper local_88;
  Message local_80 [3];
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  string der;
  ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithCustomQualifier_Test *this_local;
  
  ::std::__cxx11::string::string((string *)&gtest_ar_.message_);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"policy_1_2_3_with_custom_qualifier.pem",&local_61);
  LoadTestData((anon_unknown_0 *)local_40,&local_60,(string *)&gtest_ar_.message_);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::allocator<char>::~allocator(&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_40,
               (AssertionResult *)"LoadTestData(\"policy_1_2_3_with_custom_qualifier.pem\", &der)",
               "false","true",(char *)in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    ::std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (bVar1) {
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::vector
              ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
               &errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    CertErrors::CertErrors((CertErrors *)local_e0);
    auVar3 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)&gtest_ar_.message_);
    s._M_str = auVar3._8_8_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = auVar3._0_8_;
    s._M_len = (size_t)s._M_str;
    data = StringAsBytes((bssl *)gtest_ar__1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,s);
    bssl::der::Input::Input(&local_f8,data);
    bVar1 = ParseCertificatePoliciesExtensionOidsTest::fail_parsing_unknown_qualifier_oids
                      (&this->super_ParseCertificatePoliciesExtensionOidsTest);
    extension_value.data_.size_._0_1_ = bVar1;
    extension_value.data_.data_ = (uchar *)local_f8.data_.size_;
    extension_value.data_.size_._1_7_ = 0;
    local_e1 = ParseCertificatePoliciesExtensionOids
                         ((bssl *)local_f8.data_.data_,extension_value,
                          (bool)((char)&errors + '\x10'),
                          (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)local_e0,
                          in_R9);
    bVar1 = ParseCertificatePoliciesExtensionOidsTest::fail_parsing_unknown_qualifier_oids
                      (&this->super_ParseCertificatePoliciesExtensionOidsTest);
    if (bVar1) {
      local_129 = (bool)(~local_e1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_128,&local_129,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_128,(AssertionResult *)0x6e5a32
                   ,"true","false",(char *)in_R9);
        pcVar2 = (char *)::std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                   ,0x90,pcVar2);
        testing::internal::AssertHelper::operator=(&local_140,&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        ::std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_138);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    }
    else {
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_170,&local_e1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
      if (!bVar1) {
        testing::Message::Message(&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_170,(AssertionResult *)0x6e5a32,
                   "false","true",(char *)in_R9);
        pcVar2 = (char *)::std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                   ,0x92,pcVar2);
        testing::internal::AssertHelper::operator=(&local_180,&local_178);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        ::std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_178);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
      local_1b4 = 1;
      local_1c0 = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::size
                            ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                             &errors.nodes_.
                              super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                ((EqHelper *)local_1b0,"1U","policies.size()",&local_1b4,&local_1c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
      if (!bVar1) {
        testing::Message::Message(&local_1c8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                   ,0x93,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_1c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
      if (bVar1) {
        Span<unsigned_char_const>::Span<2ul>
                  ((Span<unsigned_char_const> *)&local_200,
                   (uchar (*) [2])&(anonymous_namespace)::policy_1_2_3_der);
        bssl::der::Input::Input(&local_1f0,local_200);
        rhs = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::operator[]
                        ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                         &errors.nodes_.
                          super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,0);
        testing::internal::EqHelper::Compare<bssl::der::Input,_bssl::der::Input,_nullptr>
                  ((EqHelper *)local_1e0,"der::Input(policy_1_2_3_der)","policies[0]",&local_1f0,rhs
                  );
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
        if (!bVar1) {
          testing::Message::Message(&local_208);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_210,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                     ,0x94,pcVar2);
          testing::internal::AssertHelper::operator=(&local_210,&local_208);
          testing::internal::AssertHelper::~AssertHelper(&local_210);
          testing::Message::~Message(&local_208);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
      }
    }
    CertErrors::~CertErrors((CertErrors *)local_e0);
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~vector
              ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
               &errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  ::std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest,
       OnePolicyWithCustomQualifier) {
  std::string der;
  ASSERT_TRUE(LoadTestData("policy_1_2_3_with_custom_qualifier.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  bool result = ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors);

  if (fail_parsing_unknown_qualifier_oids()) {
    EXPECT_FALSE(result);
  } else {
    EXPECT_TRUE(result);
    ASSERT_EQ(1U, policies.size());
    EXPECT_EQ(der::Input(policy_1_2_3_der), policies[0]);
  }
}